

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_location_path(xpath_parser *this)

{
  lexeme_t lVar1;
  xpath_ast_node *pxVar2;
  xpath_ast_node *pxVar3;
  
  lVar1 = (this->_lexer)._cur_lexeme;
  if (lVar1 == lex_double_slash) {
    xpath_lexer::next(&this->_lexer);
    pxVar3 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar3 == (xpath_ast_node *)0x0) {
      pxVar3 = (xpath_ast_node *)0x0;
    }
    else {
      pxVar3->_type = '9';
      pxVar3->_rettype = '\x01';
      pxVar3->_axis = '\0';
      pxVar3->_test = '\0';
      pxVar3->_left = (xpath_ast_node *)0x0;
      pxVar3->_right = (xpath_ast_node *)0x0;
      pxVar3->_next = (xpath_ast_node *)0x0;
    }
    if (pxVar3 != (xpath_ast_node *)0x0) {
      pxVar2 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar2 == (xpath_ast_node *)0x0) {
        pxVar2 = (xpath_ast_node *)0x0;
      }
      else {
        pxVar2->_type = '8';
        pxVar2->_rettype = '\x01';
        pxVar2->_axis = '\x05';
        pxVar2->_test = '\x02';
        pxVar2->_left = pxVar3;
        pxVar2->_right = (xpath_ast_node *)0x0;
        pxVar2->_next = (xpath_ast_node *)0x0;
        (pxVar2->_data).string = (char_t *)0x0;
      }
      if (pxVar2 != (xpath_ast_node *)0x0) goto LAB_001a1107;
    }
    return (xpath_ast_node *)0x0;
  }
  if (lVar1 == lex_slash) {
    xpath_lexer::next(&this->_lexer);
    pxVar2 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar2 == (xpath_ast_node *)0x0) {
      pxVar2 = (xpath_ast_node *)0x0;
    }
    else {
      pxVar2->_type = '9';
      pxVar2->_rettype = '\x01';
      pxVar2->_axis = '\0';
      pxVar2->_test = '\0';
      pxVar2->_left = (xpath_ast_node *)0x0;
      pxVar2->_right = (xpath_ast_node *)0x0;
      pxVar2->_next = (xpath_ast_node *)0x0;
    }
    if (pxVar2 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    lVar1 = (this->_lexer)._cur_lexeme;
    if (lex_double_dot < lVar1) {
      return pxVar2;
    }
    if ((0x1d00200U >> (lVar1 & (lex_double_dot|lex_plus)) & 1) == 0) {
      return pxVar2;
    }
  }
  else {
    pxVar2 = (xpath_ast_node *)0x0;
  }
LAB_001a1107:
  pxVar2 = parse_relative_location_path(this,pxVar2);
  return pxVar2;
}

Assistant:

xpath_ast_node* parse_location_path()
		{
			if (_lexer.current() == lex_slash)
			{
				_lexer.next();

				xpath_ast_node* n = alloc_node(ast_step_root, xpath_type_node_set);
				if (!n) return NULL;

				// relative location path can start from axis_attribute, dot, double_dot, multiply and string lexemes; any other lexeme means standalone root path
				lexeme_t l = _lexer.current();

				if (l == lex_string || l == lex_axis_attribute || l == lex_dot || l == lex_double_dot || l == lex_multiply)
					return parse_relative_location_path(n);
				else
					return n;
			}
			else if (_lexer.current() == lex_double_slash)
			{
				_lexer.next();

				xpath_ast_node* n = alloc_node(ast_step_root, xpath_type_node_set);
				if (!n) return NULL;

				n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, NULL);
				if (!n) return NULL;

				return parse_relative_location_path(n);
			}

			// else clause moved outside of if because of bogus warning 'control may reach end of non-void function being inlined' in gcc 4.0.1
			return parse_relative_location_path(NULL);
		}